

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  if (DAT_002cd4c0 != 0) {
    lVar1 = std::__cxx11::string::find(-0x48,0x3a);
    if (lVar1 == -1) {
      GTestLog::GTestLog((GTestLog *)&local_40,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/googletest/googletest/src/gtest.cc"
                         ,0x15e9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unrecognized streaming target \"",0x1f);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,FLAGS_gtest_stream_result_to_abi_cxx11_,DAT_002cd4c0
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ignored.",10);
      GTestLog::~GTestLog((GTestLog *)&local_40);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)&local_40,0x2cd4b8);
      std::__cxx11::string::substr((ulong)&local_60,0x2cd4b8);
      StreamingListener::StreamingListener(this_00,&local_40,&local_60);
      TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      GTEST_LOG_(WARNING) << "unrecognized streaming target \"" << target
                          << "\" ignored.";
    }
  }
}